

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall
QPlainTextEditPrivate::ensureVisible
          (QPlainTextEditPrivate *this,int position,bool center,bool forceCenter)

{
  QPlainTextEdit *this_00;
  QWidgetData *pQVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QTextDocumentPrivate *pQVar8;
  long in_FS_OFFSET;
  double dVar9;
  qreal qVar10;
  double dVar11;
  QPointF QVar12;
  qreal height;
  double local_c8;
  double local_c0;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  QRectF local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEdit **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  pQVar1 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  iVar4 = (pQVar1->crect).y2.m_i;
  iVar5 = (pQVar1->crect).y1.m_i;
  QVar12 = QPlainTextEdit::contentOffset(this_00);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document((QWidgetTextControl *)this->control);
  QTextDocument::findBlock((int)local_48);
  cVar3 = QTextBlock::isValid();
  if (cVar3 == '\0') goto LAB_0049e96d;
  local_78 = 0xffffffff;
  uStack_74 = 0xffffffff;
  uStack_70 = 0xffffffff;
  uStack_6c = 0xffffffff;
  local_88 = 0xffffffff;
  uStack_84 = 0xffffffff;
  uStack_80 = 0xffffffff;
  uStack_7c = 0xffffffff;
  (**(code **)(*(long *)&this->control->super_QWidgetTextControl + 0x80))
            (&local_88,this->control,local_48);
  if (((double)CONCAT44(uStack_74,local_78) <= 0.0) ||
     ((double)CONCAT44(uStack_6c,uStack_70) <= 0.0)) goto LAB_0049e96d;
  local_c0 = (double)((long)(iVar4 - iVar5) + 1);
  dVar11 = 0.0 - QVar12.yp;
  iVar4 = QTextBlock::layout();
  QTextBlock::position();
  iVar4 = QTextLayout::lineForTextPosition(iVar4);
  QTextLine::naturalTextRect();
  dVar9 = (double)CONCAT44(uStack_7c,uStack_80) +
          (double)CONCAT44(local_68.yp._4_4_,local_68.yp._0_4_);
  if (dVar11 + local_c0 <= (double)CONCAT44(local_68.h._4_4_,local_68.h._0_4_) + dVar9) {
LAB_0049e744:
    if (center) {
      local_c0 = local_c0 * 0.5;
      QTextLine::naturalTextRect();
      local_c8 = (double)CONCAT44(local_68.h._4_4_,local_68.h._0_4_) * 0.5 +
                 (double)CONCAT44(local_68.yp._4_4_,local_68.yp._0_4_);
    }
    else {
      QTextLine::naturalTextRect();
      local_c8 = (double)CONCAT44(local_68.yp._4_4_,local_68.yp._0_4_) +
                 (double)CONCAT44(local_68.h._4_4_,local_68.h._0_4_);
    }
    pQVar8 = (QTextDocumentPrivate *)local_48._0_8_;
    iVar5 = local_48._8_4_;
    if (local_c8 < local_c0) {
      QTextBlock::previous();
      cVar3 = QTextBlock::isValid();
      if (cVar3 != '\0') {
        do {
          pQVar8 = (QTextDocumentPrivate *)local_48._0_8_;
          iVar5 = local_48._8_4_;
          do {
            QTextBlock::previous();
            local_48._0_8_ = CONCAT44(local_68.xp._4_4_,local_68.xp._0_4_);
            local_48._8_4_ = local_68.yp._0_4_;
            cVar3 = QTextBlock::isVisible();
            if (cVar3 != '\0') break;
            QTextBlock::previous();
            cVar3 = QTextBlock::isValid();
          } while (cVar3 != '\0');
          QPlainTextEdit::blockBoundingRect(&local_68,this_00,(QTextBlock *)local_48);
          local_c8 = local_c8 + (double)CONCAT44(local_68.h._4_4_,local_68.h._0_4_);
          if (local_c0 <= local_c8) break;
          QTextBlock::previous();
          cVar3 = QTextBlock::isValid();
        } while (cVar3 != '\0');
      }
    }
    QTextBlock::layout();
    iVar6 = QTextLayout::lineCount();
    iVar4 = QTextBlock::blockNumber();
    qVar10 = verticalOffset(this,iVar4,0);
    iVar4 = -1;
    do {
      iVar4 = iVar4 + 1;
      if (iVar6 <= iVar4) goto LAB_0049e933;
      local_68.w._0_4_ = 0xffffffff;
      local_68.w._4_4_ = 0xffffffff;
      local_68.h._0_4_ = 0xffffffff;
      local_68.h._4_4_ = 0xffffffff;
      local_68.xp._0_4_ = 0xffffffff;
      local_68.xp._4_4_ = 0xffffffff;
      local_68.yp._0_4_ = 0xffffffff;
      local_68.yp._4_4_ = 0xffffffff;
      iVar7 = QTextBlock::layout();
      QTextLayout::lineAt(iVar7);
      QTextLine::naturalTextRect();
      bVar2 = local_c0 < (local_c8 - qVar10) - (double)CONCAT44(local_68.yp._4_4_,local_68.yp._0_4_)
      ;
    } while (bVar2);
    iVar4 = iVar4 + (uint)bVar2;
LAB_0049e933:
    if (iVar6 <= iVar4) {
      local_48._8_4_ = iVar5;
      iVar4 = 0;
      local_48._0_8_ = pQVar8;
    }
    iVar5 = QTextBlock::blockNumber();
  }
  else {
    if (center) {
      if (dVar9 < dVar11 || forceCenter) goto LAB_0049e744;
    }
    else if (forceCenter) goto LAB_0049e744;
    if (dVar11 <= dVar9) goto LAB_0049e96d;
    iVar5 = QTextBlock::blockNumber();
  }
  setTopBlock(this,iVar5,iVar4,0);
LAB_0049e96d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::ensureVisible(int position, bool center, bool forceCenter) {
    Q_Q(QPlainTextEdit);
    QRectF visible = QRectF(viewport->rect()).translated(-q->contentOffset());
    QTextBlock block = control->document()->findBlock(position);
    if (!block.isValid())
        return;
    QRectF br = control->blockBoundingRect(block);
    if (!br.isValid())
        return;
    QTextLine line = block.layout()->lineForTextPosition(position - block.position());
    Q_ASSERT(line.isValid());
    QRectF lr = line.naturalTextRect().translated(br.topLeft());

    if (lr.bottom() >= visible.bottom() || (center && lr.top() < visible.top()) || forceCenter){

        qreal height = visible.height();
        if (center)
            height /= 2;

        qreal h = center ? line.naturalTextRect().center().y() : line.naturalTextRect().bottom();

        QTextBlock previousVisibleBlock = block;
        while (h < height && block.previous().isValid()) {
            previousVisibleBlock = block;
            do {
                block = block.previous();
            } while (!block.isVisible() && block.previous().isValid());
            h += q->blockBoundingRect(block).height();
        }

        int l = 0;
        int lineCount = block.layout()->lineCount();
        qreal voffset = verticalOffset(block.blockNumber(), 0);
        while (l < lineCount) {
            QRectF lineRect = block.layout()->lineAt(l).naturalTextRect();
            if (h - voffset - lineRect.top() <= height)
                break;
            ++l;
        }

        if (l >= lineCount) {
            block = previousVisibleBlock;
            l = 0;
        }
        setTopBlock(block.blockNumber(), l);
    } else if (lr.top() < visible.top()) {
        setTopBlock(block.blockNumber(), line.lineNumber());
    }

}